

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpeedTest.cpp
# Opt level: O2

int64_t timehash_small(pfHash hash,void *key,int len,int seed)

{
  undefined1 auVar1 [16];
  uint *__dest;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  ulong extraout_RDX;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  undefined8 extraout_XMM1_Qa;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  unsigned_long_long end;
  unsigned_long_long begin;
  uint32_t hash_temp [16];
  
  hash_temp[0] = 0;
  hash_temp[1] = 0;
  hash_temp[2] = 0;
  hash_temp[3] = 0;
  hash_temp[4] = 0;
  hash_temp[5] = 0;
  hash_temp[6] = 0;
  hash_temp[7] = 0;
  hash_temp[8] = 0;
  hash_temp[9] = 0;
  hash_temp[10] = 0;
  hash_temp[0xb] = 0;
  hash_temp[0xc] = 0;
  hash_temp[0xd] = 0;
  hash_temp[0xe] = 0;
  hash_temp[0xf] = 0;
  uVar6 = 0xffffffffffffffff;
  if (-7 < len) {
    uVar6 = (long)((len + 3) / 4) << 2;
  }
  __dest = (uint *)operator_new__(uVar6);
  pvVar2 = memcpy(__dest,key,(long)len);
  iVar5 = (int)pvVar2;
  if (iVar5 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar5 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar5 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar5 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar5 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar5 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar5 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar5 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar5 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar5 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar5 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar5 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar5 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar5 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar5 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar5 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar5);
  }
  uVar6 = rdtsc();
  uVar4 = uVar6 >> 0x20;
  iVar5 = 200;
  uVar3 = uVar6;
  while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
    (*hash)(__dest,len,seed,hash_temp);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    uVar3 = hash_temp._0_8_ & 0xffffffff;
    *__dest = *__dest ^ hash_temp[0];
    seed = seed + hash_temp[0];
    uVar4 = extraout_RDX;
  }
  rdtscp();
  iVar5 = (int)uVar3;
  if (iVar5 == 0) {
    cpuid_basic_info(0);
  }
  else if (iVar5 == 1) {
    cpuid_Version_info(1);
  }
  else if (iVar5 == 2) {
    cpuid_cache_tlb_info(2);
  }
  else if (iVar5 == 3) {
    cpuid_serial_info(3);
  }
  else if (iVar5 == 4) {
    cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (iVar5 == 5) {
    cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (iVar5 == 6) {
    cpuid_Thermal_Power_Management_info(6);
  }
  else if (iVar5 == 7) {
    cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (iVar5 == 9) {
    cpuid_Direct_Cache_Access_info(9);
  }
  else if (iVar5 == 10) {
    cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (iVar5 == 0xb) {
    cpuid_Extended_Topology_info(0xb);
  }
  else if (iVar5 == 0xd) {
    cpuid_Processor_Extended_States_info(0xd);
  }
  else if (iVar5 == 0xf) {
    cpuid_Quality_of_Service_info(0xf);
  }
  else if (iVar5 == -0x7ffffffe) {
    cpuid_brand_part1_info(0x80000002);
  }
  else if (iVar5 == -0x7ffffffd) {
    cpuid_brand_part2_info(0x80000003);
  }
  else if (iVar5 == -0x7ffffffc) {
    cpuid_brand_part3_info(0x80000004);
  }
  else {
    cpuid(iVar5);
  }
  operator_delete__(__dest);
  auVar1 = vcvtusi2sd_avx512f(in_XMM1,(uVar3 & 0xffffffff | uVar4 << 0x20) - uVar6);
  return (long)(auVar1._0_8_ / 200.0);
}

Assistant:

NEVER_INLINE int64_t timehash_small ( pfHash hash, const void * key, int len, int seed )
{
  const int NUM_TRIALS = 200;
  volatile unsigned long long int begin, end;
  uint32_t hash_temp[16] = {};
  uint32_t *buf = new uint32_t[(len + 3) / 4];
  memcpy(buf,key,len);

  begin = timer_start();

  for(int i = 0; i < NUM_TRIALS; i++) {
    hash(buf,len,seed,hash_temp);
    // XXX Add dependency between invocations of hash-function to prevent parallel
    // evaluation of them. However this way the invocations still would not be
    // fully serialized. Another option is to use lfence instruction (load-from-memory
    // serialization instruction) or mfence (load-from-memory AND store-to-memory
    // serialization instruction):
    //   __asm volatile ("lfence");
    // It's hard to say which one is the most realistic and sensible approach.
    seed += hash_temp[0];
    buf[0] ^= hash_temp[0];
  }

  end = timer_end();
  delete[] buf;

  return (int64_t)((end - begin) / (double)NUM_TRIALS);
}